

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

string * __thiscall EventDataType::getOrigin_abi_cxx11_(EventDataType *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x28));
  return in_RDI;
}

Assistant:

std::string EventDataType::getOrigin() const{
    return origin;
}